

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerSafe::SetCommissionerDataset
          (CommissionerSafe *this,ErrorHandler *aHandler,CommissionerDataset *aDataset)

{
  _func_void *p_Var1;
  _Any_data local_c8;
  code *local_b8;
  code *pcStack_b0;
  CommissionerSafe *local_a8;
  _Any_data local_a0;
  long local_90;
  undefined8 uStack_88;
  CommissionerDataset local_80;
  
  local_a8 = this;
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)&local_a0,aHandler);
  CommissionerDataset::CommissionerDataset(&local_80,aDataset);
  local_b8 = (code *)0x0;
  pcStack_b0 = (code *)0x0;
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  p_Var1 = (_func_void *)operator_new(0x80);
  *(CommissionerSafe **)p_Var1 = local_a8;
  *(undefined8 *)(p_Var1 + 8) = 0;
  *(undefined8 *)(p_Var1 + 0x10) = 0;
  *(undefined8 *)(p_Var1 + 0x18) = 0;
  *(undefined8 *)(p_Var1 + 0x20) = uStack_88;
  if (local_90 != 0) {
    *(void **)(p_Var1 + 8) = local_a0._M_unused._M_object;
    *(undefined8 *)(p_Var1 + 0x10) = local_a0._8_8_;
    *(long *)(p_Var1 + 0x18) = local_90;
    local_90 = 0;
    uStack_88 = 0;
  }
  CommissionerDataset::CommissionerDataset((CommissionerDataset *)(p_Var1 + 0x28),&local_80);
  pcStack_b0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:247:22)>
               ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:247:22)>
             ::_M_manager;
  local_c8._M_unused._0_8_ = (undefined8)p_Var1;
  PushAsyncRequest(this,(AsyncRequest *)&local_c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_c8);
  SetCommissionerDataset(std::function<void(ot::commissioner::Error)>,ot::commissioner::CommissionerDataset_const&)
  ::$_0::~__0((__0 *)&local_a8);
  return;
}

Assistant:

void CommissionerSafe::SetCommissionerDataset(ErrorHandler aHandler, const CommissionerDataset &aDataset)
{
    PushAsyncRequest([=]() { mImpl->SetCommissionerDataset(aHandler, aDataset); });
}